

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::resize_nearest(Mat *src,Mat *dst,int w,int h,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ParamDict PStack_48;
  Mat *local_38;
  
  local_38 = dst;
  pLVar1 = create_layer(0x32);
  ParamDict::ParamDict(&PStack_48);
  ParamDict::set(&PStack_48,0,1);
  ParamDict::set(&PStack_48,3,h);
  ParamDict::set(&PStack_48,4,w);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&PStack_48);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,local_38,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&PStack_48);
  return;
}

Assistant:

void resize_nearest(const Mat& src, Mat& dst, int w, int h, const Option& opt)
{
    Layer* interp = create_layer(LayerType::Interp);

    ParamDict pd;
    pd.set(0, 1);
    pd.set(3, h);
    pd.set(4, w);

    interp->load_param(pd);

    interp->create_pipeline(opt);

    interp->forward(src, dst, opt);

    interp->destroy_pipeline(opt);

    delete interp;
}